

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamStandardIndex::CloseFile(BamStandardIndex *this)

{
  IBamIODevice *pIVar1;
  pointer pBVar2;
  char *pcVar3;
  int iVar4;
  
  pIVar1 = (this->m_resources).Device;
  if (pIVar1 != (IBamIODevice *)0x0) {
    iVar4 = (*pIVar1->_vptr_IBamIODevice[10])();
    if ((char)iVar4 != '\0') {
      (*((this->m_resources).Device)->_vptr_IBamIODevice[2])();
      pIVar1 = (this->m_resources).Device;
      if (pIVar1 != (IBamIODevice *)0x0) {
        (*pIVar1->_vptr_IBamIODevice[1])();
      }
      (this->m_resources).Device = (IBamIODevice *)0x0;
    }
  }
  pBVar2 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_indexFileSummary).
      super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar2) {
    (this->m_indexFileSummary).
    super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  }
  pcVar3 = (this->m_resources).Buffer;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  (this->m_resources).Buffer = (char *)0x0;
  this->m_bufferLength = 0;
  return;
}

Assistant:

void BamStandardIndex::CloseFile()
{

    // close file stream
    if (IsDeviceOpen()) {
        m_resources.Device->Close();
        delete m_resources.Device;
        m_resources.Device = 0;
    }

    // clear index file summary data
    m_indexFileSummary.clear();

    // clean up I/O buffer
    delete[] m_resources.Buffer;
    m_resources.Buffer = 0;
    m_bufferLength = 0;
}